

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaderparser.cpp
# Opt level: O3

void __thiscall QHttpHeaderParser::clear(QHttpHeaderParser *this)

{
  QArrayData *pQVar1;
  
  this->statusCode = 100;
  this->majorVersion = 0;
  this->minorVersion = 0;
  if ((this->reasonPhrase).d.ptr != (char16_t *)0x0) {
    pQVar1 = &((this->reasonPhrase).d.d)->super_QArrayData;
    (this->reasonPhrase).d.d = (Data *)0x0;
    (this->reasonPhrase).d.ptr = (char16_t *)0x0;
    (this->reasonPhrase).d.size = 0;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  QHttpHeaders::clear(&this->fields);
  return;
}

Assistant:

void QHttpHeaderParser::clear()
{
    statusCode = 100;
    majorVersion = 0;
    minorVersion = 0;
    reasonPhrase.clear();
    fields.clear();
}